

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

void soplex::
     SPxEquiliSC<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     ::computeEquiExpVec(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
                        number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *epsilon)

{
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar1;
  long lVar2;
  double __x;
  int iVar3;
  bool bVar4;
  fpclass_type fVar5;
  int32_t iVar6;
  bool bVar7;
  type_conflict5 tVar8;
  long lVar9;
  long lVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *a;
  Item *pIVar11;
  undefined4 *puVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  double *pdVar15;
  soplex *psVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  cpp_dec_float<200U,_int,_void> local_428;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxi;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_320;
  double local_2a0 [14];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  soplex local_130 [112];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [128];
  
  bVar20 = 0;
  lVar2 = 0x1c;
  for (lVar19 = 0; lVar19 < (vecset->set).thenum; lVar19 = lVar19 + 1) {
    pIVar11 = (vecset->set).theitem + (vecset->set).thekey[lVar19].idx;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              (&maxi.m_backend,0.0,(type *)0x0);
    lVar18 = 0;
    for (lVar10 = 0;
        lVar10 < (pIVar11->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused; lVar10 = lVar10 + 1) {
      pNVar1 = (pIVar11->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      puVar12 = (undefined4 *)((long)&(pNVar1->val).m_backend.data + lVar18);
      psVar16 = local_130;
      for (lVar9 = lVar2; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(undefined4 *)psVar16 = *puVar12;
        puVar12 = puVar12 + (ulong)bVar20 * -2 + 1;
        psVar16 = psVar16 + (ulong)bVar20 * -8 + 4;
      }
      local_c0 = *(undefined4 *)((long)&(pNVar1->val).m_backend.data + lVar18 + 0x70);
      local_bc = *(undefined1 *)((long)&(pNVar1->val).m_backend.data + lVar18 + 0x74);
      local_b8 = *(undefined8 *)((long)&(pNVar1->val).m_backend.data + lVar18 + 0x78);
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)local_b0,local_130,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)(uint)coScaleExp->data
                                 [*(int *)((long)(&((pIVar11->data).
                                                                                                        
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar18)],
                 (int)coScaleExp->data);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)1>>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_428,local_b0,a);
      bVar4 = local_428.neg;
      iVar3 = local_428.exp;
      pcVar13 = &local_428;
      pdVar15 = local_2a0;
      for (lVar9 = lVar2; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(uint *)pdVar15 = (((cpp_dec_float<200U,_int,_void> *)&pcVar13->data)->data)._M_elems[0];
        pcVar13 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar13 + ((ulong)bVar20 * -2 + 1) * 4);
        pdVar15 = (double *)((long)pdVar15 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      fVar5 = local_428.fpclass;
      iVar6 = local_428.prec_elem;
      pdVar15 = local_2a0;
      pnVar14 = &local_320;
      for (lVar9 = lVar2; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = *(uint *)pdVar15;
        pdVar15 = (double *)((long)pdVar15 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_320.m_backend.exp = local_428.exp;
      local_320.m_backend.neg = local_428.neg;
      local_320.m_backend.fpclass = local_428.fpclass;
      local_320.m_backend.prec_elem = local_428.prec_elem;
      pnVar14 = &maxi;
      pnVar17 = &local_1b0;
      for (lVar9 = lVar2; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = maxi.m_backend.exp;
      local_1b0.m_backend.neg = maxi.m_backend.neg;
      local_1b0.m_backend.prec_elem = maxi.m_backend.prec_elem;
      local_1b0.m_backend.fpclass = maxi.m_backend.fpclass;
      pnVar14 = epsilon;
      pnVar17 = &local_230;
      for (lVar9 = lVar2; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar17->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
        pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar17 + ((ulong)bVar20 * -2 + 1) * 4);
      }
      local_230.m_backend.exp = (epsilon->m_backend).exp;
      local_230.m_backend.neg = (epsilon->m_backend).neg;
      local_230.m_backend.fpclass = (epsilon->m_backend).fpclass;
      local_230.m_backend.prec_elem = (epsilon->m_backend).prec_elem;
      bVar7 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_320,&local_1b0,&local_230);
      if (bVar7) {
        pdVar15 = local_2a0;
        pnVar14 = &maxi;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = *(uint *)pdVar15;
          pdVar15 = (double *)((long)pdVar15 + ((ulong)bVar20 * -2 + 1) * 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar20 * -2 + 1) * 4);
        }
        maxi.m_backend.exp = iVar3;
        maxi.m_backend.neg = bVar4;
        maxi.m_backend.fpclass = fVar5;
        maxi.m_backend.prec_elem = iVar6;
      }
      lVar18 = lVar18 + 0x84;
    }
    local_428.data._M_elems[0] = 0;
    local_428.data._M_elems[1] = 0;
    tVar8 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&maxi.m_backend,(double *)&local_428);
    if (tVar8) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&maxi.m_backend,1.0);
    }
    local_2a0[0] = 1.0;
    local_428.fpclass = cpp_dec_float_finite;
    local_428.prec_elem = 0x1c;
    local_428.data._M_elems[0] = 0;
    local_428.data._M_elems[1] = 0;
    local_428.data._M_elems[2] = 0;
    local_428.data._M_elems[3] = 0;
    local_428.data._M_elems[4] = 0;
    local_428.data._M_elems[5] = 0;
    local_428.data._M_elems[6] = 0;
    local_428.data._M_elems[7] = 0;
    local_428.data._M_elems[8] = 0;
    local_428.data._M_elems[9] = 0;
    local_428.data._M_elems[10] = 0;
    local_428.data._M_elems[0xb] = 0;
    local_428.data._M_elems[0xc] = 0;
    local_428.data._M_elems[0xd] = 0;
    local_428.data._M_elems[0xe] = 0;
    local_428.data._M_elems[0xf] = 0;
    local_428.data._M_elems[0x10] = 0;
    local_428.data._M_elems[0x11] = 0;
    local_428.data._M_elems[0x12] = 0;
    local_428.data._M_elems[0x13] = 0;
    local_428.data._M_elems[0x14] = 0;
    local_428.data._M_elems[0x15] = 0;
    local_428.data._M_elems[0x16] = 0;
    local_428.data._M_elems[0x17] = 0;
    local_428.data._M_elems[0x18] = 0;
    local_428.data._M_elems[0x19] = 0;
    local_428.data._M_elems._104_5_ = 0;
    local_428.data._M_elems[0x1b]._1_3_ = 0;
    local_428.exp = 0;
    local_428.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
              (&local_428,local_2a0,&maxi.m_backend);
    __x = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::extract_double
                    (&local_428);
    frexp(__x,scaleExp->data + lVar19);
    scaleExp->data[lVar19] = scaleExp->data[lVar19] + -1;
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}